

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O2

int __thiscall ScapeGoatTree::addWithDepth(ScapeGoatTree *this,Node *node)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Node *pNVar3;
  Node *pNVar4;
  int iVar5;
  Node *pNVar6;
  
  pNVar6 = this->root;
  if (pNVar6 != (Node *)0x0) {
    iVar5 = 1;
    do {
      if (node->value < pNVar6->value) {
        pNVar3 = pNVar6->leftChild;
        if (pNVar6->leftChild == (Node *)0x0) goto LAB_00107663;
      }
      else {
        if (node->value <= pNVar6->value) {
          return -1;
        }
        pNVar4 = pNVar6;
        pNVar3 = pNVar6->rightChild;
        if (pNVar6->rightChild == (Node *)0x0) goto LAB_0010766c;
      }
      pNVar6 = pNVar3;
      iVar5 = iVar5 + 1;
    } while( true );
  }
  this->root = node;
  iVar5 = 0;
LAB_00107673:
  uVar1 = this->n;
  uVar2 = this->q;
  this->n = uVar1 + 1;
  this->q = uVar2 + 1;
  return iVar5;
LAB_00107663:
  pNVar4 = (Node *)&pNVar6->leftChild;
LAB_0010766c:
  pNVar4->rightChild = node;
  node->parent = pNVar6;
  goto LAB_00107673;
}

Assistant:

int ScapeGoatTree::addWithDepth(Node *node) {
    Node *w = root;
    if (w == nullptr) {
        root = node;
        n++;
        q++;
        return 0;
    }
    bool done = false;
    int d = 0;
    do {
        if (node->value < w->value) {
            if (w->leftChild == nullptr) {
                w->leftChild = node;
                node->parent = w;
                done = true;
            } else {
                w = w->leftChild;
            }
        } else if (node->value > w->value) {
            if (w->rightChild == nullptr) {
                w->rightChild = node;
                node->parent = w;
                done = true;
            } else {
                w = w->rightChild;
            }
        } else {
            return -1;
        }
        d++;
    } while (!done);

    n++;
    q++;
    return d;
}